

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void normalize_suite::normalize_increasing(void)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_06;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_06;
  array<int,_4UL> *paVar1;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  initializer_list<int> input_02;
  initializer_list<int> __l_02;
  initializer_list<int> input_03;
  initializer_list<int> __l_03;
  initializer_list<int> input_04;
  initializer_list<int> __l_04;
  initializer_list<int> input_05;
  initializer_list<int> __l_05;
  initializer_list<int> input_06;
  initializer_list<int> __l_06;
  iterator iVar2;
  allocator_type local_199;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  int local_148 [6];
  iterator local_130;
  iterator local_120;
  iterator local_110;
  iterator local_100;
  iterator local_f0;
  iterator local_e0;
  iterator local_d0;
  iterator local_c0;
  iterator local_b0;
  iterator local_a0;
  iterator local_90;
  iterator local_80;
  iterator local_70;
  iterator local_60;
  iterator local_50;
  iterator local_40;
  
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  input._M_len = 1;
  input._M_array = (iterator)&expect;
  span.member.data = array._M_elems;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd95,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd97,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_40 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd9b,"void normalize_suite::normalize_increasing()",iVar2,local_40,second_begin,
             second_end);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_50 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd9d,"void normalize_suite::normalize_increasing()",iVar2,local_50,array._M_elems,
             array._M_elems + span.member.size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  input_00._M_len = 2;
  input_00._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_00);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda2,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda4,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0xb;
  local_148[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_60 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_00._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_00._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_00._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_00._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda8,"void normalize_suite::normalize_increasing()",iVar2,local_60,second_begin_00,
             second_end_00);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_70 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdaa,"void normalize_suite::normalize_increasing()",iVar2,local_70,array._M_elems,
             array._M_elems + span.member.size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input_01._M_len = 3;
  input_01._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_01);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdaf,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb1,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0xb;
  local_148[1] = 0x16;
  local_148[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_80 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_01._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_01._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_01._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_01._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb5,"void normalize_suite::normalize_increasing()",iVar2,local_80,second_begin_01,
             second_end_01);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb7,"void normalize_suite::normalize_increasing()",iVar2,local_90,array._M_elems,
             array._M_elems + span.member.size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_02._M_len = 4;
  input_02._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_02);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdbc,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdbe,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0xb;
  local_148[1] = 0x16;
  local_148[2] = 0x21;
  local_148[3] = 0x2c;
  __l_02._M_len = 4;
  __l_02._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_02,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_a0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_02._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_02._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_02._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_02._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc2,"void normalize_suite::normalize_increasing()",iVar2,local_a0,second_begin_02,
             second_end_02);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_b0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc4,"void normalize_suite::normalize_increasing()",iVar2,local_b0,array._M_elems,
             local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input_03._M_len = 5;
  input_03._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_03);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc9,"void normalize_suite::normalize_increasing()",paVar1 != &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdcb,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0x16;
  local_148[1] = 0x21;
  local_148[2] = 0x2c;
  local_148[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_03,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_c0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_03._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_03._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_03._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_03._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdcf,"void normalize_suite::normalize_increasing()",iVar2,local_c0,second_begin_03,
             second_end_03);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_d0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd1,"void normalize_suite::normalize_increasing()",iVar2,local_d0,array._M_elems,
             local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  input_04._M_len = 6;
  input_04._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_04);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd6,"void normalize_suite::normalize_increasing()",paVar1 != &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd8,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0x21;
  local_148[1] = 0x2c;
  local_148[2] = 0x37;
  local_148[3] = 0x42;
  __l_04._M_len = 4;
  __l_04._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_04,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_e0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_04._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_04._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_04._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_04._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xddc,"void normalize_suite::normalize_increasing()",iVar2,local_e0,second_begin_04,
             second_end_04);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_f0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdde,"void normalize_suite::normalize_increasing()",iVar2,local_f0,array._M_elems,
             local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_05._M_len = 7;
  input_05._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_05);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde3,"void normalize_suite::normalize_increasing()",paVar1 != &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde5,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0x2c;
  local_148[1] = 0x37;
  local_148[2] = 0x42;
  local_148[3] = 0x4d;
  __l_05._M_len = 4;
  __l_05._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_05,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_100 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_05._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_05._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_05._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_05._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde9,"void normalize_suite::normalize_increasing()",iVar2,local_100,second_begin_05,
             second_end_05);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_110 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdeb,"void normalize_suite::normalize_increasing()",iVar2,local_110,array._M_elems,
             local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = 0x16;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_06._M_len = 8;
  input_06._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_06);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf0,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = iVar2.parent._0_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = iVar2.parent._4_4_;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)iVar2.current;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = iVar2.current._4_4_;
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf2,"void normalize_suite::normalize_increasing()",paVar1 == &array);
  local_148[0] = 0x37;
  local_148[1] = 0x42;
  local_148[2] = 0x4d;
  local_148[3] = 0x58;
  __l_06._M_len = 4;
  __l_06._M_array = local_148;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_06,&local_199);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_120 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_begin_06._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin_06._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  second_end_06._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_06._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf6,"void normalize_suite::normalize_increasing()",iVar2,local_120,second_begin_06,
             second_end_06);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_130 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf8,"void normalize_suite::normalize_increasing()",iVar2,local_130,array._M_elems,
             local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void normalize_increasing()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // 11 X X X => 11 X X X
        span = { 11 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 X X => 11 22 X X
        span = { 11, 22 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 33 X => 11 22 33 X
        span = { 11, 22, 33 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 33 44 => 11 22 33 44
        span = { 11, 22, 33, 44 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 22 33 44 => 22 33 44 55
        span = { 11, 22, 33, 44, 55 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 33 44 => 33 44 55 66
        span = { 11, 22, 33, 44, 55, 66 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44, 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 77 44 => 44 55 66 77
        span = { 11, 22, 33, 44, 55, 66, 77 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44, 55, 66, 77 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 77 88 => 55 66 77 88
        span = { 11, 22, 33, 44, 55, 66, 77, 88 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 55, 66, 77, 88 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
}